

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stop_time.c
# Opt level: O0

timepoint_precision_t parse_timepoint_precision(char *value)

{
  int iVar1;
  char *value_local;
  
  iVar1 = strcmp(value,"0");
  if (iVar1 == 0) {
    value_local._4_4_ = TP_APPROXIMATE;
  }
  else {
    iVar1 = strcmp(value,"1");
    if ((iVar1 != 0) && (iVar1 = strcmp(value,""), iVar1 != 0)) {
      return TP_NOT_SET;
    }
    value_local._4_4_ = TP_EXACT;
  }
  return value_local._4_4_;
}

Assistant:

timepoint_precision_t parse_timepoint_precision(const char *value) {
    if (strcmp(value, "0") == 0)
        return TP_APPROXIMATE;
    else if (strcmp(value, "1") == 0 || strcmp(value, "") == 0)
        return TP_EXACT;
    else
        return TP_NOT_SET;
}